

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O1

void vrna_md_set_nonstandards(vrna_md_t *md,char *ns_bases)

{
  char cVar1;
  char cVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  
  if (md == (vrna_md_t *)0x0) {
    return;
  }
  if (ns_bases == (char *)0x0) {
    md->nonstandards[0] = '\0';
    free(nonstandards);
    nonstandards = (char *)0x0;
  }
  else {
    sVar6 = strlen(ns_bases);
    if ((uint)sVar6 < 0x21) {
      cVar1 = *ns_bases;
      pcVar9 = ns_bases + (cVar1 == '-');
      uVar8 = 0;
      do {
        cVar2 = *pcVar9;
        pcVar10 = pcVar9;
        if (cVar2 != ',') {
          iVar7 = (int)uVar8;
          lVar11 = (long)iVar7;
          if (cVar2 == '\0') goto LAB_0012bd7a;
          pcVar10 = pcVar9 + 1;
          uVar8 = lVar11 + 2;
          md->nonstandards[lVar11] = cVar2;
          md->nonstandards[lVar11 + 1] = pcVar9[1];
          if ((cVar1 == '-') && (pcVar9[1] != *pcVar9)) {
            md->nonstandards[lVar11 + 2] = pcVar9[1];
            uVar8 = (ulong)(iVar7 + 4);
            md->nonstandards[lVar11 + 3] = *pcVar9;
          }
        }
        pcVar9 = pcVar10 + 1;
      } while( true );
    }
    vrna_message_warning("vrna_md_set_nonstandards: list too long, dropping nonstandards!");
  }
LAB_0012bdb1:
  vrna_md_update(md);
  return;
LAB_0012bd7a:
  md->nonstandards[lVar11] = '\0';
  free(nonstandards);
  pcVar9 = (char *)vrna_alloc(0x21);
  uVar3 = *(undefined8 *)(md->nonstandards + 8);
  uVar4 = *(undefined8 *)(md->nonstandards + 0x10);
  uVar5 = *(undefined8 *)(md->nonstandards + 0x18);
  nonstandards = pcVar9;
  *(undefined8 *)pcVar9 = *(undefined8 *)md->nonstandards;
  *(undefined8 *)(pcVar9 + 8) = uVar3;
  *(undefined8 *)(pcVar9 + 0x10) = uVar4;
  *(undefined8 *)(pcVar9 + 0x18) = uVar5;
  pcVar9[0x20] = md->nonstandards[0x20];
  goto LAB_0012bdb1;
}

Assistant:

PUBLIC void
vrna_md_set_nonstandards(vrna_md_t  *md,
                         const char *ns_bases)
{
  const char    *c;
  unsigned int  n;
  int           i, sym;

  if (md) {
    if (ns_bases) {
      n = strlen(ns_bases);
      if (n < 33) {
        /* parse the ns_bases list */
        c = ns_bases;
        i = sym = 0;
        if (*c == '-') {
          sym = 1;
          c++;
        }

        while (*c != '\0') {
          if (*c != ',') {
            md->nonstandards[i++] = *c++;
            md->nonstandards[i++] = *c;
            if ((sym) && (*c != *(c - 1))) {
              md->nonstandards[i++] = *c;
              md->nonstandards[i++] = *(c - 1);
            }
          }

          c++;
        }
        md->nonstandards[i] = '\0';

#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
        free(nonstandards);
        nonstandards = vrna_alloc(33);
        memcpy(nonstandards, &(md->nonstandards[0]), 33 * sizeof(char));
#endif
      } else {
        vrna_message_warning("vrna_md_set_nonstandards: list too long, dropping nonstandards!");
      }
    } else {
      /* remove nonstandards */
      md->nonstandards[0] = '\0';
#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
      free(nonstandards);
      nonstandards = NULL;
#endif
    }

    /* update pair/rtype/alias arrays accordingly */
    vrna_md_update(md);
  }
}